

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_helper<void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&),void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
::_call<0,1>(cni_helper<void_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&),_void_(*)(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&)>
             *this,vector *args,sequence<0,_1> *param_3)

{
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__args_1;
  reference val;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  function<void_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&)>
  *in_RSI;
  var *in_stack_00000100;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RSI,0);
  __args_1 = try_convert_and_check<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
             ::convert(in_stack_00000100);
  val = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                  ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RSI,1);
  try_convert_and_check<const_cs_impl::any_&,_const_cs_impl::any_&,_cs_impl::any,_1UL>::convert(val)
  ;
  std::
  function<void_(std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_cs_impl::any_&)>::
  operator()(in_RSI,in_RDX,(any *)__args_1);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}